

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O3

void pdqsort_detail::
     pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsPrimalHeuristics::setupIntCols()::__0,false>
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,
               anon_class_8_1_8991fb9c comp,int bad_allowed,bool leftmost)

{
  int *piVar1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end_00;
  int iVar2;
  long lVar3;
  bool bVar4;
  HighsInt *pHVar5;
  HighsInt *pHVar6;
  int iVar7;
  ulong uVar8;
  HighsInt HVar9;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsPrimalHeuristics_cpp:51:43)>
  __cmp;
  long lVar10;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var11;
  HighsInt HVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  int *piVar16;
  ulong uVar17;
  long lVar18;
  HighsInt *pHVar19;
  long lVar20;
  _DistanceType __len;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_88;
  ulong local_68;
  int local_4c;
  
  lVar20 = (long)end._M_current - (long)begin._M_current;
  uVar8 = lVar20 >> 2;
  local_88._M_current = begin._M_current;
  local_4c = bad_allowed;
  if ((long)uVar8 < 0x18) {
    if (!leftmost) {
LAB_002d6d85:
      pHVar5 = begin._M_current + 1;
      if (begin._M_current + 1 == end._M_current || begin._M_current == end._M_current) {
        return;
      }
      do {
        pHVar6 = pHVar5;
        bVar4 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                          ((anon_class_8_1_8991fb9c *)comp.this,begin._M_current[1],
                           *begin._M_current);
        if (bVar4) {
          HVar9 = *pHVar6;
          pHVar5 = pHVar6;
          do {
            pHVar19 = pHVar5 + -2;
            *pHVar5 = pHVar5[-1];
            pHVar5 = pHVar5 + -1;
            bVar4 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                              ((anon_class_8_1_8991fb9c *)comp.this,HVar9,*pHVar19);
          } while (bVar4);
          *pHVar5 = HVar9;
        }
        pHVar5 = pHVar6 + 1;
        begin._M_current = pHVar6;
      } while (pHVar6 + 1 != end._M_current);
      return;
    }
  }
  else {
    do {
      uVar15 = uVar8 >> 1;
      if (uVar8 < 0x81) {
        bVar4 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                          ((anon_class_8_1_8991fb9c *)comp.this,*local_88._M_current,
                           local_88._M_current[uVar15]);
        HVar9 = *local_88._M_current;
        if (bVar4) {
          HVar9 = local_88._M_current[uVar15];
          local_88._M_current[uVar15] = *local_88._M_current;
          *local_88._M_current = HVar9;
        }
        bVar4 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                          ((anon_class_8_1_8991fb9c *)comp.this,end._M_current[-1],HVar9);
        if (bVar4) {
          iVar7 = *local_88._M_current;
          *local_88._M_current = end._M_current[-1];
          end._M_current[-1] = iVar7;
        }
        bVar4 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                          ((anon_class_8_1_8991fb9c *)comp.this,*local_88._M_current,
                           local_88._M_current[uVar15]);
        HVar9 = *local_88._M_current;
        if (bVar4) {
          HVar9 = local_88._M_current[uVar15];
          local_88._M_current[uVar15] = *local_88._M_current;
          *local_88._M_current = HVar9;
        }
      }
      else {
        bVar4 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                          ((anon_class_8_1_8991fb9c *)comp.this,local_88._M_current[uVar15],
                           *local_88._M_current);
        HVar9 = local_88._M_current[uVar15];
        if (bVar4) {
          HVar9 = *local_88._M_current;
          *local_88._M_current = local_88._M_current[uVar15];
          local_88._M_current[uVar15] = HVar9;
        }
        bVar4 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                          ((anon_class_8_1_8991fb9c *)comp.this,end._M_current[-1],HVar9);
        if (bVar4) {
          iVar7 = local_88._M_current[uVar15];
          local_88._M_current[uVar15] = end._M_current[-1];
          end._M_current[-1] = iVar7;
        }
        bVar4 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                          ((anon_class_8_1_8991fb9c *)comp.this,local_88._M_current[uVar15],
                           *local_88._M_current);
        if (bVar4) {
          iVar7 = *local_88._M_current;
          *local_88._M_current = local_88._M_current[uVar15];
          local_88._M_current[uVar15] = iVar7;
        }
        bVar4 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                          ((anon_class_8_1_8991fb9c *)comp.this,local_88._M_current[uVar15 - 1],
                           local_88._M_current[1]);
        HVar9 = local_88._M_current[uVar15 - 1];
        if (bVar4) {
          HVar9 = local_88._M_current[1];
          local_88._M_current[1] = local_88._M_current[uVar15 - 1];
          local_88._M_current[uVar15 - 1] = HVar9;
        }
        bVar4 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                          ((anon_class_8_1_8991fb9c *)comp.this,end._M_current[-2],HVar9);
        if (bVar4) {
          iVar7 = local_88._M_current[uVar15 - 1];
          local_88._M_current[uVar15 - 1] = end._M_current[-2];
          end._M_current[-2] = iVar7;
        }
        bVar4 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                          ((anon_class_8_1_8991fb9c *)comp.this,local_88._M_current[uVar15 - 1],
                           local_88._M_current[1]);
        if (bVar4) {
          iVar7 = local_88._M_current[1];
          local_88._M_current[1] = local_88._M_current[uVar15 - 1];
          local_88._M_current[uVar15 - 1] = iVar7;
        }
        bVar4 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                          ((anon_class_8_1_8991fb9c *)comp.this,local_88._M_current[uVar15 + 1],
                           local_88._M_current[2]);
        HVar9 = local_88._M_current[uVar15 + 1];
        if (bVar4) {
          HVar9 = local_88._M_current[2];
          local_88._M_current[2] = local_88._M_current[uVar15 + 1];
          local_88._M_current[uVar15 + 1] = HVar9;
        }
        bVar4 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                          ((anon_class_8_1_8991fb9c *)comp.this,end._M_current[-3],HVar9);
        if (bVar4) {
          iVar7 = local_88._M_current[uVar15 + 1];
          local_88._M_current[uVar15 + 1] = end._M_current[-3];
          end._M_current[-3] = iVar7;
        }
        bVar4 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                          ((anon_class_8_1_8991fb9c *)comp.this,local_88._M_current[uVar15 + 1],
                           local_88._M_current[2]);
        if (bVar4) {
          iVar7 = local_88._M_current[2];
          local_88._M_current[2] = local_88._M_current[uVar15 + 1];
          local_88._M_current[uVar15 + 1] = iVar7;
        }
        bVar4 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                          ((anon_class_8_1_8991fb9c *)comp.this,local_88._M_current[uVar15],
                           local_88._M_current[uVar15 - 1]);
        HVar9 = local_88._M_current[uVar15];
        if (bVar4) {
          HVar9 = local_88._M_current[uVar15 - 1];
          local_88._M_current[uVar15 - 1] = local_88._M_current[uVar15];
          local_88._M_current[uVar15] = HVar9;
        }
        bVar4 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                          ((anon_class_8_1_8991fb9c *)comp.this,local_88._M_current[uVar15 + 1],
                           HVar9);
        HVar9 = local_88._M_current[uVar15];
        HVar12 = HVar9;
        if (bVar4) {
          HVar12 = local_88._M_current[uVar15 + 1];
          local_88._M_current[uVar15] = HVar12;
          local_88._M_current[uVar15 + 1] = HVar9;
        }
        bVar4 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                          ((anon_class_8_1_8991fb9c *)comp.this,HVar12,
                           local_88._M_current[uVar15 - 1]);
        iVar7 = local_88._M_current[uVar15];
        if (bVar4) {
          iVar7 = local_88._M_current[uVar15 - 1];
          local_88._M_current[uVar15 - 1] = local_88._M_current[uVar15];
          local_88._M_current[uVar15] = iVar7;
        }
        iVar2 = *local_88._M_current;
        *local_88._M_current = iVar7;
        local_88._M_current[uVar15] = iVar2;
        HVar9 = *local_88._M_current;
      }
      if ((leftmost & 1U) == 0) {
        bVar4 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                          ((anon_class_8_1_8991fb9c *)comp.this,local_88._M_current[-1],HVar9);
        HVar9 = *local_88._M_current;
        if (bVar4) goto LAB_002d6826;
        lVar20 = 0;
        do {
          bVar4 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                            ((anon_class_8_1_8991fb9c *)comp.this,HVar9,
                             *(HighsInt *)((long)end._M_current + lVar20 + -4));
          lVar20 = lVar20 + -4;
        } while (bVar4);
        pHVar5 = (HighsInt *)((long)end._M_current + lVar20);
        _Var11._M_current = local_88._M_current;
        if (lVar20 == -4) {
          do {
            if (pHVar5 <= _Var11._M_current) break;
            pHVar6 = _Var11._M_current + 1;
            _Var11._M_current = _Var11._M_current + 1;
            bVar4 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                              ((anon_class_8_1_8991fb9c *)comp.this,HVar9,*pHVar6);
          } while (!bVar4);
        }
        else {
          do {
            pHVar6 = _Var11._M_current + 1;
            _Var11._M_current = _Var11._M_current + 1;
            bVar4 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                              ((anon_class_8_1_8991fb9c *)comp.this,HVar9,*pHVar6);
          } while (!bVar4);
        }
        while (_Var11._M_current < pHVar5) {
          HVar12 = *_Var11._M_current;
          *_Var11._M_current = *pHVar5;
          *pHVar5 = HVar12;
          do {
            pHVar6 = pHVar5 + -1;
            pHVar5 = pHVar5 + -1;
            bVar4 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                              ((anon_class_8_1_8991fb9c *)comp.this,HVar9,*pHVar6);
          } while (bVar4);
          do {
            pHVar6 = _Var11._M_current + 1;
            _Var11._M_current = _Var11._M_current + 1;
            bVar4 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                              ((anon_class_8_1_8991fb9c *)comp.this,HVar9,*pHVar6);
          } while (!bVar4);
        }
        *local_88._M_current = *pHVar5;
        *pHVar5 = HVar9;
        begin._M_current = pHVar5 + 1;
        lVar14 = (long)end._M_current - (long)begin._M_current;
        uVar8 = lVar14 >> 2;
      }
      else {
LAB_002d6826:
        uVar15 = 0;
        do {
          uVar17 = uVar15;
          uVar15 = uVar17 + 4;
          bVar4 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                            ((anon_class_8_1_8991fb9c *)comp.this,
                             *(HighsInt *)((long)local_88._M_current + uVar17 + 4),HVar9);
        } while (bVar4);
        piVar1 = local_88._M_current + uVar15;
        _Var11._M_current = end._M_current;
        if (uVar15 == 4) {
          do {
            if (_Var11._M_current <= piVar1) break;
            pHVar5 = _Var11._M_current + -1;
            _Var11._M_current = _Var11._M_current + -1;
            bVar4 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                              ((anon_class_8_1_8991fb9c *)comp.this,*pHVar5,HVar9);
          } while (!bVar4);
        }
        else {
          do {
            pHVar5 = _Var11._M_current + -1;
            _Var11._M_current = _Var11._M_current + -1;
            bVar4 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                              ((anon_class_8_1_8991fb9c *)comp.this,*pHVar5,HVar9);
          } while (!bVar4);
        }
        piVar16 = _Var11._M_current;
        if (piVar1 < _Var11._M_current) {
          do {
            iVar7 = *(local_88._M_current + uVar15);
            *(local_88._M_current + uVar15) = *piVar16;
            *piVar16 = iVar7;
            do {
              uVar17 = uVar15;
              uVar15 = uVar17 + 4;
              bVar4 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                                ((anon_class_8_1_8991fb9c *)comp.this,
                                 *(HighsInt *)((long)local_88._M_current + uVar17 + 4),HVar9);
            } while (bVar4);
            do {
              pHVar5 = piVar16 + -1;
              piVar16 = piVar16 + -1;
              bVar4 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                                ((anon_class_8_1_8991fb9c *)comp.this,*pHVar5,HVar9);
            } while (!bVar4);
          } while (local_88._M_current + uVar15 < piVar16);
        }
        end_00._M_current = local_88._M_current + uVar17;
        pHVar5 = (HighsInt *)((long)local_88._M_current + uVar17);
        begin._M_current = pHVar5 + 1;
        *local_88._M_current = *pHVar5;
        *pHVar5 = HVar9;
        uVar15 = (long)end_00._M_current - (long)local_88._M_current >> 2;
        lVar14 = (long)end._M_current - (long)begin._M_current;
        uVar13 = lVar14 >> 2;
        if (((long)uVar15 < (long)(uVar8 >> 3)) || ((long)uVar13 < (long)(uVar8 >> 3))) {
          local_4c = local_4c + -1;
          if (local_4c == 0) {
            uVar15 = uVar8 - 2 >> 1;
            do {
              std::
              __adjust_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,int,__gnu_cxx::__ops::_Iter_comp_iter<HighsPrimalHeuristics::setupIntCols()::__0>>
                        (local_88,uVar15,uVar8,local_88._M_current[uVar15],
                         (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsPrimalHeuristics_cpp:51:43)>
                          )comp.this);
              bVar4 = uVar15 != 0;
              uVar15 = uVar15 - 1;
            } while (bVar4);
            if (lVar20 < 5) {
              return;
            }
            lVar20 = (long)end._M_current - (long)local_88._M_current;
            do {
              end._M_current = end._M_current + -1;
              iVar7 = *end._M_current;
              *end._M_current = *local_88._M_current;
              lVar20 = lVar20 + -4;
              std::
              __adjust_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,int,__gnu_cxx::__ops::_Iter_comp_iter<HighsPrimalHeuristics::setupIntCols()::__0>>
                        (local_88,0,lVar20 >> 2,iVar7,
                         (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsPrimalHeuristics_cpp:51:43)>
                          )comp.this);
            } while (4 < lVar20);
            return;
          }
          if (0x17 < (long)uVar15) {
            uVar8 = uVar15 & 0xfffffffffffffffc;
            iVar7 = *local_88._M_current;
            *local_88._M_current = *(local_88._M_current + uVar8);
            *(local_88._M_current + uVar8) = iVar7;
            iVar7 = end_00._M_current[-1];
            end_00._M_current[-1] = *(end_00._M_current - uVar8);
            *(end_00._M_current - uVar8) = iVar7;
            if (0x80 < uVar15) {
              uVar15 = uVar15 >> 2;
              iVar7 = local_88._M_current[1];
              local_88._M_current[1] = local_88._M_current[uVar15 + 1];
              local_88._M_current[uVar15 + 1] = iVar7;
              iVar7 = local_88._M_current[2];
              local_88._M_current[2] = local_88._M_current[uVar15 + 2];
              local_88._M_current[uVar15 + 2] = iVar7;
              iVar7 = end_00._M_current[-2];
              end_00._M_current[-2] = end_00._M_current[~uVar15];
              end_00._M_current[~uVar15] = iVar7;
              iVar7 = end_00._M_current[-3];
              end_00._M_current[-3] = end_00._M_current[-2 - uVar15];
              end_00._M_current[-2 - uVar15] = iVar7;
            }
          }
          if (0x17 < (long)uVar13) {
            uVar8 = uVar13 & 0xfffffffffffffffc;
            iVar7 = end_00._M_current[1];
            end_00._M_current[1] = *(end_00._M_current + uVar8 + 4);
            *(end_00._M_current + uVar8 + 4) = iVar7;
            iVar7 = end._M_current[-1];
            end._M_current[-1] = *(end._M_current - uVar8);
            *(end._M_current - uVar8) = iVar7;
            if (0x80 < uVar13) {
              uVar8 = uVar13 >> 2;
              iVar7 = end_00._M_current[2];
              end_00._M_current[2] = end_00._M_current[uVar8 + 2];
              end_00._M_current[uVar8 + 2] = iVar7;
              iVar7 = end_00._M_current[3];
              end_00._M_current[3] = end_00._M_current[uVar8 + 3];
              end_00._M_current[uVar8 + 3] = iVar7;
              iVar7 = end._M_current[-2];
              end._M_current[-2] = end._M_current[~uVar8];
              end._M_current[~uVar8] = iVar7;
              iVar7 = end._M_current[-3];
              end._M_current[-3] = end._M_current[-2 - uVar8];
              end._M_current[-2 - uVar8] = iVar7;
            }
          }
        }
        else if (_Var11._M_current <= piVar1) {
          if ((uVar17 & 0xfffffffffffffffb) != 0) {
            lVar20 = 4;
            local_68 = 0;
            piVar1 = local_88._M_current + 1;
            _Var11._M_current = local_88._M_current;
            do {
              piVar16 = piVar1;
              bVar4 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                                ((anon_class_8_1_8991fb9c *)comp.this,_Var11._M_current[1],
                                 *_Var11._M_current);
              if (bVar4) {
                HVar9 = _Var11._M_current[1];
                lVar10 = lVar20;
                do {
                  *(undefined4 *)((long)local_88._M_current + lVar10) =
                       *(undefined4 *)((long)local_88._M_current + lVar10 + -4);
                  _Var11._M_current = local_88._M_current;
                  if (lVar10 == 4) goto LAB_002d6b9c;
                  bVar4 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                                    ((anon_class_8_1_8991fb9c *)comp.this,HVar9,
                                     *(HighsInt *)((long)local_88._M_current + lVar10 + -8));
                  lVar10 = lVar10 + -4;
                } while (bVar4);
                _Var11._M_current = (HighsInt *)(lVar10 + (long)local_88._M_current);
LAB_002d6b9c:
                *_Var11._M_current = HVar9;
                local_68 = local_68 + ((long)piVar16 - (long)_Var11._M_current >> 2);
                if (8 < local_68) goto LAB_002d6a9b;
              }
              lVar20 = lVar20 + 4;
              piVar1 = piVar16 + 1;
              _Var11._M_current = piVar16;
            } while (piVar16 + 1 != end_00._M_current);
          }
          if (begin._M_current == end._M_current) {
            return;
          }
          if (end_00._M_current + 2 == end._M_current) {
            return;
          }
          lVar20 = 8;
          lVar10 = 0;
          uVar8 = 0;
          pHVar5 = begin._M_current;
          do {
            HVar9 = *pHVar5;
            pHVar5 = (HighsInt *)((long)end_00._M_current + lVar20);
            bVar4 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                              ((anon_class_8_1_8991fb9c *)comp.this,
                               *(HighsInt *)((long)end_00._M_current + lVar20),HVar9);
            if (bVar4) {
              HVar9 = *pHVar5;
              lVar3 = lVar10;
              do {
                lVar18 = lVar3;
                *(undefined4 *)((long)end_00._M_current + lVar18 + 8) =
                     *(undefined4 *)((long)end_00._M_current + lVar18 + 4);
                pHVar6 = begin._M_current;
                pHVar19 = begin._M_current;
                if (lVar18 == 0) goto LAB_002d6c93;
                bVar4 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                                  ((anon_class_8_1_8991fb9c *)comp.this,HVar9,
                                   *(HighsInt *)((long)end_00._M_current + lVar18));
                lVar3 = lVar18 + -4;
              } while (bVar4);
              pHVar6 = (HighsInt *)((long)end_00._M_current + lVar18 + 4);
              pHVar19 = (HighsInt *)((long)local_88._M_current + lVar18 + -4 + uVar17 + 8);
LAB_002d6c93:
              *pHVar6 = HVar9;
              uVar8 = uVar8 + ((long)pHVar5 - (long)pHVar19 >> 2);
              if (8 < uVar8) break;
            }
            lVar3 = lVar20 + 4;
            lVar20 = lVar20 + 4;
            lVar10 = lVar10 + 4;
            if (end_00._M_current + lVar3 == end._M_current) {
              return;
            }
          } while( true );
        }
LAB_002d6a9b:
        pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsPrimalHeuristics::setupIntCols()::__0,false>
                  (local_88,end_00,comp,local_4c,(bool)(leftmost & 1));
        leftmost = false;
        uVar8 = uVar13;
      }
      lVar20 = lVar14;
      local_88._M_current = begin._M_current;
    } while (0x17 < (long)uVar8);
    if ((leftmost & 1U) == 0) goto LAB_002d6d85;
  }
  if (begin._M_current + 1 != end._M_current && begin._M_current != end._M_current) {
    lVar20 = 4;
    pHVar5 = begin._M_current + 1;
    pHVar6 = begin._M_current;
    do {
      pHVar19 = pHVar5;
      bVar4 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                        ((anon_class_8_1_8991fb9c *)comp.this,pHVar6[1],*pHVar6);
      if (bVar4) {
        HVar9 = *pHVar19;
        lVar14 = lVar20;
        do {
          *(undefined4 *)((long)begin._M_current + lVar14) =
               *(undefined4 *)((long)begin._M_current + lVar14 + -4);
          pHVar5 = begin._M_current;
          if (lVar14 == 4) goto LAB_002d6559;
          bVar4 = HighsPrimalHeuristics::setupIntCols::anon_class_8_1_8991fb9c::operator()
                            ((anon_class_8_1_8991fb9c *)comp.this,HVar9,
                             *(HighsInt *)((long)begin._M_current + lVar14 + -8));
          lVar14 = lVar14 + -4;
        } while (bVar4);
        pHVar5 = (HighsInt *)(lVar14 + (long)begin._M_current);
LAB_002d6559:
        *pHVar5 = HVar9;
      }
      lVar20 = lVar20 + 4;
      pHVar5 = pHVar19 + 1;
      pHVar6 = pHVar19;
    } while (pHVar19 + 1 != end._M_current);
  }
  return;
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }